

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * __thiscall
tinygraph::any_to_str_abi_cxx11_(string *__return_storage_ptr__,tinygraph *this,any *val)

{
  bool bVar1;
  int __val;
  type_info *ptVar2;
  char *__s;
  float __val_00;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  any *local_18;
  any *val_local;
  
  local_18 = (any *)this;
  val_local = (any *)__return_storage_ptr__;
  ptVar2 = std::any::type((any *)this);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&int::typeinfo);
  if (bVar1) {
    __val = std::any_cast<int>(local_18);
    std::__cxx11::to_string(__return_storage_ptr__,__val);
  }
  else {
    ptVar2 = std::any::type(local_18);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&std::__cxx11::string::typeinfo);
    if (bVar1) {
      std::any_cast<std::__cxx11::string>(__return_storage_ptr__,local_18);
    }
    else {
      ptVar2 = std::any::type(local_18);
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&float::typeinfo);
      if (bVar1) {
        __val_00 = std::any_cast<float>(local_18);
        std::__cxx11::to_string(__return_storage_ptr__,__val_00);
      }
      else {
        ptVar2 = std::any::type(local_18);
        bVar1 = std::type_info::operator==(ptVar2,(type_info *)&char_const*::typeinfo);
        if (bVar1) {
          __s = std::any_cast<char_const*>(local_18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,__s,&local_19);
          std::allocator<char>::~allocator(&local_19);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"<value>",local_2d);
          std::allocator<char>::~allocator(local_2d);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string any_to_str(const std::any* val) {
        if (val->type() == typeid(int)) {
            return std::to_string(std::any_cast<int>(*val));
        } else if (val->type() == typeid(std::string)) {
            return std::any_cast<std::string>(*val);
        } else if (val->type() == typeid(float)) {
            return std::to_string(std::any_cast<float>(*val));
        } else if (val->type() == typeid(const char*)) {
            return std::any_cast<const char*>(*val);
        } else {
            return "<value>";
        }
    }